

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

int dump_elem(lyout *out,lyxml_elem *e,int level,int options,int last_elem)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int options_00;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  lyxml_attr *plVar9;
  lyxml_elem *e_00;
  ulong uVar10;
  
  if (e->name == (char *)0x0) {
    if (e->content == (char *)0x0) {
      return 0;
    }
    iVar2 = lyxml_dump_text(out,e->content,LYXML_DATA_ELEM);
    return iVar2;
  }
  pcVar4 = "\n";
  if ((options & 2U) == 0) {
    pcVar4 = "";
  }
  if (((e->flags & 1U) != 0) ||
     ((pcVar7 = pcVar4, e->parent != (lyxml_elem *)0x0 && ((e->parent->flags & 1U) != 0)))) {
    pcVar7 = "";
  }
  uVar8 = level * 2;
  if ((e->parent != (lyxml_elem *)0x0) && ((e->parent->flags & 1U) != 0)) {
    pcVar4 = "";
    uVar8 = 0;
  }
  pcVar5 = "";
  if ((options & 0x20U) == 0) {
    pcVar5 = pcVar4;
  }
  if (last_elem == 0) {
    pcVar5 = pcVar4;
  }
  if ((options & 0xdU) == 0 || (options & 1U) != 0) {
    if ((e->ns == (lyxml_ns *)0x0) || (e->ns->prefix == (char *)0x0)) {
      uVar1 = ly_print(out,"%*s<%s",(ulong)uVar8);
    }
    else {
      uVar1 = ly_print(out,"%*s<%s:%s",(ulong)uVar8);
    }
    uVar10 = (ulong)uVar1;
LAB_00123614:
    for (plVar9 = e->attr; iVar3 = (int)uVar10, plVar9 != (lyxml_attr *)0x0; plVar9 = plVar9->next)
    {
      if (plVar9->type == LYXML_ATTR_NS) {
        pcVar4 = plVar9->name;
        pcVar6 = plVar9->value;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "";
        }
        if (pcVar4 == (char *)0x0) {
          iVar2 = ly_print(out," xmlns=\"%s\"",pcVar6);
        }
        else {
          pcVar6 = " xmlns:%s=\"%s\"";
LAB_0012368b:
          iVar2 = ly_print(out,pcVar6,pcVar4);
        }
      }
      else {
        if ((plVar9->ns == (lyxml_ns *)0x0) || (plVar9->ns->prefix == (char *)0x0)) {
          pcVar4 = plVar9->name;
          pcVar6 = " %s=\"%s\"";
          goto LAB_0012368b;
        }
        iVar2 = ly_print(out," %s:%s=\"%s\"");
      }
      uVar10 = (ulong)(uint)(iVar3 + iVar2);
    }
    if ((~options & 5U) == 0) {
      iVar2 = ly_print(out,"/>%s",pcVar7);
      return iVar2 + iVar3;
    }
    if ((options & 1U) != 0) {
      ly_print(out,">");
      return iVar3 + 1;
    }
    if ((options & 8U) != 0) {
      return iVar3;
    }
    if ((e->child == (lyxml_elem *)0x0) && ((e->content == (char *)0x0 || (*e->content == '\0')))) {
      iVar2 = ly_print(out,"/>%s",pcVar7);
    }
    else {
      if ((e->content == (char *)0x0) || (*e->content == '\0')) {
        iVar2 = ly_print(out,">%s",pcVar7);
        iVar2 = iVar2 + iVar3;
        e_00 = e->child;
        if (e_00 != (lyxml_elem *)0x0) {
          do {
            if ((options & 2U) == 0) {
              options_00 = 0;
              iVar3 = level;
            }
            else {
              options_00 = 2;
              iVar3 = level + 1;
            }
            iVar3 = dump_elem(out,e_00,iVar3,options_00,0);
            iVar2 = iVar2 + iVar3;
            e_00 = e_00->next;
          } while (e_00 != (lyxml_elem *)0x0);
        }
        uVar10 = (ulong)uVar8;
        goto LAB_00123555;
      }
      ly_print(out,">");
      iVar2 = lyxml_dump_text(out,e->content,LYXML_DATA_ELEM);
      iVar3 = iVar3 + iVar2 + 1;
      if ((e->ns == (lyxml_ns *)0x0) || (pcVar4 = e->ns->prefix, pcVar4 == (char *)0x0)) {
        iVar2 = ly_print(out,"</%s>%s",e->name,pcVar7);
      }
      else {
        iVar2 = ly_print(out,"</%s:%s>%s",pcVar4,e->name,pcVar7);
      }
    }
    iVar3 = iVar3 + iVar2;
  }
  else {
    uVar10 = 0;
    iVar2 = 0;
    if ((options & 4U) == 0) goto LAB_00123614;
LAB_00123555:
    if ((e->ns == (lyxml_ns *)0x0) || (pcVar4 = e->ns->prefix, pcVar4 == (char *)0x0)) {
      pcVar4 = e->name;
      pcVar7 = "%*s</%s>%s";
    }
    else {
      pcVar5 = e->name;
      pcVar7 = "%*s</%s:%s>%s";
    }
    iVar3 = ly_print(out,pcVar7,uVar10,"",pcVar4,pcVar5);
    iVar3 = iVar3 + iVar2;
  }
  return iVar3;
}

Assistant:

static int
dump_elem(struct lyout *out, const struct lyxml_elem *e, int level, int options, int last_elem)
{
    int size = 0;
    struct lyxml_attr *a;
    struct lyxml_elem *child;
    const char *delim, *delim_outer;
    int indent;

    if (!e->name) {
        /* mixed content */
        if (e->content) {
            return lyxml_dump_text(out, e->content, LYXML_DATA_ELEM);
        } else {
            return 0;
        }
    }

    delim = delim_outer = (options & LYXML_PRINT_FORMAT) ? "\n" : "";
    indent = 2 * level;
    if ((e->flags & LYXML_ELEM_MIXED) || (e->parent && (e->parent->flags & LYXML_ELEM_MIXED))) {
        delim = "";
    }
    if (e->parent && (e->parent->flags & LYXML_ELEM_MIXED)) {
        delim_outer = "";
        indent = 0;
    }
    if (last_elem && (options & LYXML_PRINT_NO_LAST_NEWLINE)) {
        delim_outer = "";
    }

    if (!(options & (LYXML_PRINT_OPEN | LYXML_PRINT_CLOSE | LYXML_PRINT_ATTRS)) || (options & LYXML_PRINT_OPEN))  {
        /* opening tag */
        if (e->ns && e->ns->prefix) {
            size += ly_print(out, "%*s<%s:%s", indent, "", e->ns->prefix, e->name);
        } else {
            size += ly_print(out, "%*s<%s", indent, "", e->name);
        }
    } else if (options & LYXML_PRINT_CLOSE) {
        indent = 0;
        goto close;
    }

    /* attributes */
    for (a = e->attr; a; a = a->next) {
        if (a->type == LYXML_ATTR_NS) {
            if (a->name) {
                size += ly_print(out, " xmlns:%s=\"%s\"", a->name, a->value ? a->value : "");
            } else {
                size += ly_print(out, " xmlns=\"%s\"", a->value ? a->value : "");
            }
        } else if (a->ns && a->ns->prefix) {
            size += ly_print(out, " %s:%s=\"%s\"", a->ns->prefix, a->name, a->value);
        } else {
            size += ly_print(out, " %s=\"%s\"", a->name, a->value);
        }
    }

    /* apply options */
    if ((options & LYXML_PRINT_CLOSE) && (options & LYXML_PRINT_OPEN)) {
        size += ly_print(out, "/>%s", delim);
        return size;
    } else if (options & LYXML_PRINT_OPEN) {
        ly_print(out, ">");
        return ++size;
    } else if (options & LYXML_PRINT_ATTRS) {
        return size;
    }

    if (!e->child && (!e->content || !e->content[0])) {
        size += ly_print(out, "/>%s", delim);
        return size;
    } else if (e->content && e->content[0]) {
        ly_print(out, ">");
        size++;

        size += lyxml_dump_text(out, e->content, LYXML_DATA_ELEM);

        if (e->ns && e->ns->prefix) {
            size += ly_print(out, "</%s:%s>%s", e->ns->prefix, e->name, delim);
        } else {
            size += ly_print(out, "</%s>%s", e->name, delim);
        }
        return size;
    } else {
        size += ly_print(out, ">%s", delim);
    }

    /* go recursively */
    LY_TREE_FOR(e->child, child) {
        if (options & LYXML_PRINT_FORMAT) {
            size += dump_elem(out, child, level + 1, LYXML_PRINT_FORMAT, 0);
        } else {
            size += dump_elem(out, child, level, 0, 0);
        }
    }

close:
    /* closing tag */
    if (e->ns && e->ns->prefix) {
        size += ly_print(out, "%*s</%s:%s>%s", indent, "", e->ns->prefix, e->name, delim_outer);
    } else {
        size += ly_print(out, "%*s</%s>%s", indent, "", e->name, delim_outer);
    }

    return size;
}